

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O3

mz_bool mz_zip_validate_file(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  long lVar1;
  mz_zip_internal_state *pmVar2;
  uint uVar3;
  bool bVar4;
  mz_bool mVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  mz_uint8 *pCentral_dir_header;
  ulong uVar12;
  mz_zip_error mVar13;
  short *psVar14;
  bool bVar15;
  mz_uint32 uncomp_crc32;
  mz_bool found_zip64_ext_data_in_cdir;
  mz_uint8 descriptor_buf [32];
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  ulong local_530;
  uint local_524;
  ulong local_520;
  ulong local_518;
  uint local_510;
  mz_bool local_50c;
  uint local_508;
  uint local_504;
  uint local_500;
  uint local_4fc;
  uint local_4f8;
  uint local_4f4;
  mz_zip_array local_4e8;
  int local_4c8;
  ushort local_4c2;
  uint local_4ba;
  uint local_4b6;
  uint local_4b2;
  ushort local_4ae;
  ushort local_4ac;
  short *local_4a0;
  mz_uint64 local_498;
  long local_490;
  mz_zip_archive_file_stat local_488;
  
  local_50c = 0;
  local_524 = 0;
  local_4e8.m_capacity = 0;
  local_4e8.m_p = (short *)0x0;
  local_4e8.m_size = 0;
  local_4e8.m_element_size = 1;
  local_4e8._28_4_ = 0;
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar2 = pZip->m_pState;
  if ((((pmVar2 == (mz_zip_internal_state *)0x0) || (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
      (pZip->m_pFree == (mz_free_func)0x0)) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
LAB_0010a459:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (pZip->m_total_files < file_index) goto LAB_0010a459;
  if (file_index < pZip->m_total_files) {
    pCentral_dir_header =
         (mz_uint8 *)
         ((ulong)*(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
         (long)(pmVar2->m_central_dir).m_p);
  }
  else {
    pCentral_dir_header = (mz_uint8 *)0x0;
  }
  mVar5 = mz_zip_file_stat_internal(pZip,file_index,pCentral_dir_header,&local_488,&local_50c);
  if (mVar5 == 0) {
    return 0;
  }
  if (local_488.m_is_directory != 0) {
    return 1;
  }
  if (local_488.m_uncomp_size == 0) {
    return 1;
  }
  if (local_488.m_is_encrypted != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if ((local_488.m_method & 0xfff7) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  if (local_488.m_is_supported == 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    return 0;
  }
  sVar7 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_488.m_local_header_ofs,&local_4c8,0x1e);
  if (sVar7 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_4c8 != 0x4034b50) {
LAB_0010a5af:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar10 = (ulong)local_4ae;
  local_530 = (ulong)local_4ac;
  local_520 = (ulong)local_4b6;
  local_518 = (ulong)local_4b2;
  local_510 = (uint)local_4c2;
  sVar8 = strlen(local_488.m_filename);
  if (sVar8 != uVar10) goto LAB_0010a5af;
  local_498 = local_488.m_local_header_ofs + uVar10 + 0x1e;
  local_490 = local_498 + local_530;
  if (pZip->m_archive_size < local_488.m_comp_size + local_490) goto LAB_0010a5af;
  sVar7 = local_530;
  if (local_4ac < local_4ae) {
    sVar7 = uVar10;
  }
  if (((int)sVar7 != 0) &&
     (mVar5 = mz_zip_array_ensure_capacity(pZip,&local_4e8,sVar7,0), mVar5 == 0)) {
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    goto LAB_0010a8aa;
  }
  if (uVar10 == 0) {
LAB_0010a66a:
    psVar14 = (short *)local_4e8.m_p;
    if (local_4ac != 0) {
      if ((int)local_518 == -1 || (int)local_520 == -1) {
        sVar7 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_498,local_4e8.m_p,local_530);
        if (sVar7 != local_530) goto LAB_0010a74e;
        do {
          if ((uint)local_530 < 4) {
LAB_0010a8a2:
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            goto LAB_0010a8aa;
          }
          lVar1 = (ulong)(ushort)psVar14[1] + 4;
          uVar11 = (uint)lVar1;
          if ((uint)local_530 < uVar11) goto LAB_0010a8a2;
          if (*psVar14 == 1) {
            if ((ushort)psVar14[1] < 0x10) goto LAB_0010a8a2;
            local_518 = *(ulong *)(psVar14 + 2);
            local_520 = *(ulong *)(psVar14 + 6);
            bVar4 = true;
            goto LAB_0010a6f3;
          }
          psVar14 = (short *)((long)psVar14 + lVar1);
          uVar11 = (uint)local_530 - uVar11;
          local_530 = (ulong)uVar11;
        } while (uVar11 != 0);
      }
    }
    bVar4 = false;
LAB_0010a6f3:
    if ((local_4ba == 0 && local_520 == 0) && (local_510 & 8) != 0) {
      sVar7 = 0x18;
      if (!bVar4) {
        sVar7 = (ulong)(pmVar2->m_zip64 != 0) * 8 + 0x10;
      }
      sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_490 + local_488.m_comp_size,&local_508,sVar7
                              );
      mVar13 = MZ_ZIP_FILE_READ_FAILED;
      if (sVar9 == sVar7) {
        bVar15 = local_508 == 0x8074b50;
        uVar11 = local_508;
        if (bVar15) {
          uVar11 = local_504;
        }
        if (bVar15) {
          local_504 = local_500;
        }
        uVar10 = (ulong)local_504;
        if (bVar15) {
          local_500 = local_4fc;
        }
        uVar12 = (ulong)local_500;
        if (!(bool)(~bVar4 & pmVar2->m_zip64 == 0)) {
          uVar10 = CONCAT44(local_500,local_504);
          uVar3 = local_4f8;
          if (local_508 == 0x8074b50) {
            uVar3 = local_4f4;
            local_4fc = local_4f8;
          }
          uVar12 = CONCAT44(uVar3,local_4fc);
        }
        mVar13 = MZ_ZIP_VALIDATION_FAILED;
        if (((uVar11 == local_488.m_crc32) && (uVar10 == local_488.m_comp_size)) &&
           (uVar12 == local_488.m_uncomp_size)) goto LAB_0010a830;
      }
      pZip->m_last_error = mVar13;
      goto LAB_0010a8aa;
    }
    if (((local_4ba == local_488.m_crc32) && (local_520 == local_488.m_comp_size)) &&
       (local_518 == local_488.m_uncomp_size)) {
LAB_0010a830:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e8.m_p);
      if ((flags >> 0xd & 1) != 0) {
        return 1;
      }
      mVar5 = mz_zip_reader_extract_to_callback
                        (pZip,file_index,mz_zip_compute_crc32_callback,&local_524,0);
      if (mVar5 != 0) {
        if (local_524 != local_488.m_crc32) {
          pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
          return 0;
        }
        return 1;
      }
      return 0;
    }
  }
  else {
    local_4a0 = (short *)local_4e8.m_p;
    sVar7 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_488.m_local_header_ofs + 0x1e,local_4e8.m_p,
                             uVar10);
    if (sVar7 != uVar10) {
LAB_0010a74e:
      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      goto LAB_0010a8aa;
    }
    iVar6 = bcmp(local_488.m_filename,local_4a0,uVar10);
    if (iVar6 == 0) goto LAB_0010a66a;
  }
  pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
LAB_0010a8aa:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e8.m_p);
  return 0;
}

Assistant:

mz_bool mz_zip_validate_file(mz_zip_archive *pZip, mz_uint file_index, mz_uint flags)
{
    mz_zip_archive_file_stat file_stat;
    mz_zip_internal_state *pState;
    const mz_uint8 *pCentral_dir_header;
    mz_bool found_zip64_ext_data_in_cdir = MZ_FALSE;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint64 local_header_ofs = 0;
    mz_uint32 local_header_filename_len, local_header_extra_len, local_header_crc32;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_uint32 uncomp_crc32 = MZ_CRC32_INIT;
    mz_bool has_data_descriptor;
    mz_uint32 local_header_bit_flags;

    mz_zip_array file_data_array;
    mz_zip_array_init(&file_data_array, 1);

    if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (file_index > pZip->m_total_files)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    pCentral_dir_header = mz_zip_get_cdh(pZip, file_index);

    if (!mz_zip_file_stat_internal(pZip, file_index, pCentral_dir_header, &file_stat, &found_zip64_ext_data_in_cdir))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_uncomp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_is_encrypted)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports stored and deflate. */
    if ((file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    if (!file_stat.m_is_supported)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

    /* Read and parse the local directory entry. */
    local_header_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    local_header_filename_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    local_header_crc32 = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_CRC32_OFS);
    local_header_bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    has_data_descriptor = (local_header_bit_flags & 8) != 0;

    if (local_header_filename_len != strlen(file_stat.m_filename))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (!mz_zip_array_resize(pZip, &file_data_array, MZ_MAX(local_header_filename_len, local_header_extra_len), MZ_FALSE))
    {
        mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        goto handle_failure;
    }

    if (local_header_filename_len)
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE, file_data_array.m_p, local_header_filename_len) != local_header_filename_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        /* I've seen 1 archive that had the same pathname, but used backslashes in the local dir and forward slashes in the central dir. Do we care about this? For now, this case will fail validation. */
        if (memcmp(file_stat.m_filename, file_data_array.m_p, local_header_filename_len) != 0)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_uint32 extra_size_remaining = local_header_extra_len;
        const mz_uint8 *pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                goto handle_failure;
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                goto handle_failure;
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                    goto handle_failure;
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64));

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    /* TODO: parse local header extra data when local_header_comp_size is 0xFFFFFFFF! (big_descriptor.zip) */
    /* I've seen zips in the wild with the data descriptor bit set, but proper local header values and bogus data descriptors */
    if ((has_data_descriptor) && (!local_header_comp_size) && (!local_header_crc32))
    {
        mz_uint8 descriptor_buf[32];
        mz_bool has_id;
        const mz_uint8 *pSrc;
        mz_uint32 file_crc32;
        mz_uint64 comp_size = 0, uncomp_size = 0;

        mz_uint32 num_descriptor_uint32s = ((pState->m_zip64) || (found_zip64_ext_data_in_ldir)) ? 6 : 4;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size, descriptor_buf, sizeof(mz_uint32) * num_descriptor_uint32s) != (sizeof(mz_uint32) * num_descriptor_uint32s))
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        has_id = (MZ_READ_LE32(descriptor_buf) == MZ_ZIP_DATA_DESCRIPTOR_ID);
        pSrc = has_id ? (descriptor_buf + sizeof(mz_uint32)) : descriptor_buf;

        file_crc32 = MZ_READ_LE32(pSrc);

        if ((pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            comp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32) + sizeof(mz_uint64));
        }
        else
        {
            comp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32) + sizeof(mz_uint32));
        }

        if ((file_crc32 != file_stat.m_crc32) || (comp_size != file_stat.m_comp_size) || (uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }
    else
    {
        if ((local_header_crc32 != file_stat.m_crc32) || (local_header_comp_size != file_stat.m_comp_size) || (local_header_uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    mz_zip_array_clear(pZip, &file_data_array);

    if ((flags & MZ_ZIP_FLAG_VALIDATE_HEADERS_ONLY) == 0)
    {
        if (!mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_compute_crc32_callback, &uncomp_crc32, 0))
            return MZ_FALSE;

        /* 1 more check to be sure, although the extract checks too. */
        if (uncomp_crc32 != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            return MZ_FALSE;
        }
    }

    return MZ_TRUE;

handle_failure:
    mz_zip_array_clear(pZip, &file_data_array);
    return MZ_FALSE;
}